

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::dummyCommandQueue(CLIntercept *this,cl_context context,cl_device_id device)

{
  SConfig *pSVar1;
  cl_icd_dispatch *pcVar2;
  CEnumNameMap *this_00;
  cl_device_id in_RDX;
  cl_context in_RSI;
  CLIntercept *in_RDI;
  float __x;
  double __x_00;
  cl_command_queue dummy;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  cl_command_queue_properties props;
  mutex_type *in_stack_ffffffffffffff48;
  lock_guard<std::mutex> *in_stack_ffffffffffffff50;
  string local_88 [28];
  cl_int in_stack_ffffffffffffff94;
  cl_int local_60 [5];
  allocator local_49;
  string local_48 [40];
  ulong local_20;
  cl_device_id local_18;
  cl_context local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pSVar1 = config(in_RDI);
  if ((pSVar1->DummyOutOfOrderQueue & 1U) != 0) {
    pcVar2 = dispatch(in_RDI);
    (*pcVar2->clGetDeviceInfo)(local_18,0x102a,8,&local_20,(size_t *)0x0);
    if ((local_20 & 1) != 0) {
      std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::allocator<char>::allocator();
      __x_00 = (double)std::__cxx11::string::string
                                 (local_48,"Creating and destroying a dummy out-of-order queue.\n",
                                  &local_49);
      log(in_RDI,__x_00);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      local_60[0] = 0;
      pcVar2 = dispatch(in_RDI);
      this_00 = (CEnumNameMap *)(*pcVar2->clCreateCommandQueue)(local_10,local_18,1,local_60);
      if (local_60[0] == 0) {
        pcVar2 = dispatch(in_RDI);
        (*pcVar2->clReleaseCommandQueue)((cl_command_queue)this_00);
      }
      else {
        enumName(in_RDI);
        CEnumNameMap::name_abi_cxx11_(this_00,in_stack_ffffffffffffff94);
        __x = (float)std::__cxx11::string::c_str();
        logf(in_RDI,__x);
        std::__cxx11::string::~string(local_88);
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x206cf5);
    }
  }
  return;
}

Assistant:

void CLIntercept::dummyCommandQueue(
    cl_context context,
    cl_device_id device )
{
    if( config().DummyOutOfOrderQueue )
    {
        cl_command_queue_properties props;
        dispatch().clGetDeviceInfo(
            device,
            CL_DEVICE_QUEUE_ON_HOST_PROPERTIES,
            sizeof(props),
            &props,
            NULL );
        if( props & CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE )
        {
            std::lock_guard<std::mutex> lock(m_Mutex);

            log( "Creating and destroying a dummy out-of-order queue.\n" );

            cl_int  errorCode = CL_SUCCESS;
            cl_command_queue dummy = dispatch().clCreateCommandQueue(
                context,
                device,
                CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE,
                &errorCode );
            if( errorCode == CL_SUCCESS )
            {
                dispatch().clReleaseCommandQueue( dummy );
            }
            else
            {
                logf( "Error creating dummy command queue!  %s (%i)\n",
                    enumName().name( errorCode ).c_str(),
                    errorCode );
            }
        }
    }
}